

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

Err * vm_run(VM *vm,int fn_idx,int ins_idx)

{
  BcIns *pBVar1;
  BcOp BVar2;
  Err *pEVar3;
  size_t idx;
  double right_9;
  double left_9;
  double right_8;
  double left_8;
  double right_7;
  double left_7;
  double right_6;
  double left_6;
  double right_5;
  double left_5;
  double right_4;
  double left_4;
  double right_3;
  double left_3;
  double right_2;
  double left_2;
  double right_1;
  double left_1;
  double right;
  double left;
  Err *err;
  BcIns *ip;
  Function *fn;
  Value *stk;
  Value *k;
  Trace *trace;
  uint8_t loop_iter_count [1024];
  void **dispatch;
  int ins_idx_local;
  int fn_idx_local;
  VM *vm_local;
  
  memset(&trace,0,0x400);
  pBVar1 = vm->fns[fn_idx].ins;
  fn_dump(vm->fns + fn_idx);
  BVar2 = bc_op(pBVar1[ins_idx]);
  pEVar3 = (Err *)(*(code *)vm_run::interpreter_dispatch[BVar2])();
  return pEVar3;
}

Assistant:

static Err * vm_run(VM *vm, int fn_idx, int ins_idx) {
	// Dispatch table when we're running the regular interpreter without a JIT
	// trace
	static void *interpreter_dispatch[] = {
		// Stores
		&&op_MOV, &&op_SET_N, &&op_SET_P, &&op_SET_F,

		// Arithmetic operators
		&&op_ADD_LL, &&op_ADD_LN, &&op_SUB_LL, &&op_SUB_LN, &&op_SUB_NL,
		&&op_MUL_LL, &&op_MUL_LN, &&op_DIV_LL, &&op_DIV_LN, &&op_DIV_NL,
		&&op_NEG,

		// Relational operators
		&&op_EQ_LL, &&op_EQ_LN, &&op_EQ_LP, &&op_NEQ_LL, &&op_NEQ_LN,
		&&op_NEQ_LP, &&op_LT_LL, &&op_LT_LN, &&op_LE_LL, &&op_LE_LN,
		&&op_GT_LL, &&op_GT_LN, &&op_GE_LL, &&op_GE_LN,

		// Control flow
		&&op_JMP, &&op_LOOP, &&op_CALL, &&op_RET,
	};

	// Dispatch table for when we're running a JIT trace
	static void *jit_dispatch[] = {
		// Stores
		&&jit_MOV, &&jit_SET_N, &&jit_SET_P, &&jit_SET_F,

		// Arithmetic operators
		&&jit_ADD_LL, &&jit_ADD_LN, &&jit_SUB_LL, &&jit_SUB_LN, &&jit_SUB_NL,
		&&jit_MUL_LL, &&jit_MUL_LN, &&jit_DIV_LL, &&jit_DIV_LN, &&jit_DIV_NL,
		&&jit_NEG,

		// Relational operators
		&&jit_EQ_LL, &&jit_EQ_LN, &&jit_EQ_LP, &&jit_NEQ_LL, &&jit_NEQ_LN,
		&&jit_NEQ_LP, &&jit_LT_LL, &&jit_LT_LN, &&jit_LE_LL, &&jit_LE_LN,
		&&jit_GT_LL, &&jit_GT_LN, &&jit_GE_LL, &&jit_GE_LN,

		// Control flow
		&&jit_JMP, &&jit_LOOP, &&jit_CALL, &&jit_RET,
	};

	// The current dispatch table. This determines whether we jump to the normal
	// `op_XXX` instructions, or the special `jit_XXX` instructions. We swap
	// dispatch tables when we want to start a JIT trace, and swap them back 
	// when we want to end it.
	void **dispatch = interpreter_dispatch;

	// Loop iteration table, which keeps track of how many iterations each loop
	// has completed so far. When the number of iterations hits the threshold, 
	// we start a JIT trace
	#define ITER_TABLE_SIZE 1024
	uint8_t loop_iter_count[ITER_TABLE_SIZE] = {0};

	// Information about the current JIT trace that we're recording.
	Trace *trace = NULL;

	// Move some variables into the function's local scope
	Value *k = vm->consts;
	Value *stk = vm->stack;

	// Move some important state information into local variables for easy
	// access
	Function *fn = &vm->fns[fn_idx]; // Currently executing function
	BcIns *ip = &fn->ins[ins_idx];   // Current instruction
	Err *err = NULL;                 // Most recent error
	fn_dump(fn);

	// Some helpful macros to reduce repetition
#define OPCODE(mnemonic)                 \
	jit_##mnemonic:                      \
		jit_rec_##mnemonic(trace, *ip); \
	op_##mnemonic:
#define DISPATCH() goto *dispatch[bc_op(*ip)]
#define NEXT() goto *dispatch[bc_op(*(++ip))]

	// Execute the first instruction
	DISPATCH();


	// ---- Storage -----------------------------------------------------------

OPCODE(MOV)
	stk[bc_arg1(*ip)] = stk[bc_arg16(*ip)];
	NEXT();
OPCODE(SET_N)
	stk[bc_arg1(*ip)] = k[bc_arg16(*ip)];
	NEXT();
OPCODE(SET_P)
	stk[bc_arg1(*ip)] = TAG_PRIM | bc_arg16(*ip);
	NEXT();
OPCODE(SET_F)
	stk[bc_arg1(*ip)] = TAG_FN | bc_arg16(*ip);
	NEXT();


	// ---- Arithmetic Operations ---------------------------------------------

#define BC_ARITH(name, operation)                      \
	OPCODE(name##_LL) {                                \
		double left = v2n(stk[bc_arg2(*ip)]);          \
		double right = v2n(stk[bc_arg3(*ip)]);         \
		stk[bc_arg1(*ip)] = n2v(left operation right); \
		NEXT();                                        \
	}                                                  \
	OPCODE(name##_LN) {                                \
		double left = v2n(stk[bc_arg2(*ip)]);          \
		double right = v2n(k[bc_arg3(*ip)]);           \
		stk[bc_arg1(*ip)] = n2v(left operation right); \
		NEXT();                                        \
	}

#define BC_ARITH_NON_COMMUTATIVE(name, operation)      \
	BC_ARITH(name, operation)                          \
	OPCODE(name##_NL) {                                \
		double left = v2n(k[bc_arg2(*ip)]);            \
		double right = v2n(stk[bc_arg3(*ip)]);         \
		stk[bc_arg1(*ip)] = n2v(left operation right); \
		NEXT();                                        \
	}

	BC_ARITH(ADD, +)
	BC_ARITH_NON_COMMUTATIVE(SUB, -)
	BC_ARITH(MUL, *)
	BC_ARITH_NON_COMMUTATIVE(DIV, /)

OPCODE(NEG)
	stk[bc_arg1(*ip)] = n2v(-v2n(stk[bc_arg16(*ip)]));
	NEXT();


	// ---- Relational Operators ----------------------------------------------

#define BC_EQ(name, op)                                               \
	OPCODE(name##_LL)                                                 \
		if (stk[bc_arg1(*ip)] op stk[bc_arg2(*ip)]) { ip++; }         \
		NEXT();                                                       \
	OPCODE(name##_LN)                                                 \
		if (stk[bc_arg1(*ip)] op k[bc_arg2(*ip)]) { ip++; }           \
		NEXT();                                                       \
	OPCODE(name##_LP)                                                 \
		if (stk[bc_arg1(*ip)] op (TAG_PRIM | bc_arg2(*ip))) { ip++; } \
		NEXT();

	// We invert the condition because we want to skip the following JMP only
	// if the condition turns out to be false - we want to take the JMP if the
	// condition is true
	BC_EQ(EQ, !=)
	BC_EQ(NEQ, ==)

#define BC_ORD(name, op)                                                \
	OPCODE(name##_LL)                                                   \
		if (v2n(stk[bc_arg1(*ip)]) op v2n(stk[bc_arg2(*ip)])) { ip++; } \
		NEXT();                                                         \
	OPCODE(name##_LN)                                                   \
		if (v2n(stk[bc_arg1(*ip)]) op v2n(k[bc_arg2(*ip)])) { ip++; }   \
		NEXT();

	// Invert the conditions, for the reason given above
	BC_ORD(LT, >=)
	BC_ORD(LE, >)
	BC_ORD(GT, <=)
	BC_ORD(GE, <)


	// ---- Control Flow ------------------------------------------------------

	// Halt the JIT trace when we reach the end of the loop we're JITing
jit_LOOP:
	jit_rec_finish(trace);
	dispatch = interpreter_dispatch;
	goto finish; // TODO

	// Hot loop detection is pretty simple. If a loop is executed more than 50
	// times, start a JIT trace. We keep track of loop iteration counts using
	// the instruction pointer as an index to a table. We reduce the resolution
	// of the table by bit-shifting the IP left by 2, and modulo-ing the pointer
	// by the size of the table. We don't really care about the high collision
	// rate this might cause.
op_LOOP: {
	size_t idx = (((uintptr_t) ip) >> 2) & (ITER_TABLE_SIZE - 1);
	loop_iter_count[idx]++;
	if (loop_iter_count[idx] >= JIT_THRESHOLD) {
		// Reset the iteration count
		loop_iter_count[idx] = 0;

		// Create a new trace (we only ever create one trace at the moment, so
		// don't worry about freeing any previous trace)
		trace = jit_trace_new(vm);

		// Start the JIT trace by swapping out the dispatch table
		dispatch = jit_dispatch;
	}
}

	// We don't bother JITing JMPs, we just follow them wherever they go and
	// record the next instruction. Guards are added only when we enounter the
	// above conditional instructions
jit_JMP:
op_JMP:
	ip += (int32_t) bc_arg24(*ip) - JMP_BIAS;
	NEXT();

OPCODE(CALL) // TODO
OPCODE(RET)  // TODO
	// Fall through to finish for now...

finish:
	// Termination
	printf("First stack slot %g\n", v2n(stk[0]));
	return err;
}